

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_ext_free(lysf_ctx *ctx,lysp_ext *ext)

{
  lysp_ext_instance *plVar1;
  lysc_ext_instance *plVar2;
  ly_bool lVar3;
  uint64_t c__;
  lysp_ext_instance *plVar4;
  uint64_t c___1;
  long lVar5;
  void *pvVar6;
  
  lydict_remove(ctx->ctx,ext->name);
  lydict_remove(ctx->ctx,ext->argname);
  lydict_remove(ctx->ctx,ext->dsc);
  lydict_remove(ctx->ctx,ext->ref);
  lVar5 = 0;
  plVar4 = (lysp_ext_instance *)0x0;
  while (plVar1 = ext->exts, plVar1 != (lysp_ext_instance *)0x0) {
    if (plVar1[-1].exts <= plVar4) {
      free(&plVar1[-1].exts);
      break;
    }
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar5));
    plVar4 = (lysp_ext_instance *)((long)&plVar4->name + 1);
    lVar5 = lVar5 + 0x70;
  }
  if (ext->compiled != (lysc_ext *)0x0) {
    lVar3 = ly_set_contains(&ctx->ext_set,ext->compiled,(uint32_t *)0x0);
    if (lVar3 == '\0') {
      lVar5 = 0;
      ly_set_add(&ctx->ext_set,ext->compiled,'\0',(uint32_t *)0x0);
      pvVar6 = (void *)0x0;
      while (plVar2 = ext->compiled->exts, plVar2 != (lysc_ext_instance *)0x0) {
        if (plVar2[-1].compiled <= pvVar6) {
          free(&plVar2[-1].compiled);
          break;
        }
        lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar2->def + lVar5));
        pvVar6 = (void *)((long)pvVar6 + 1);
        lVar5 = lVar5 + 0x48;
      }
      ext->compiled = (lysc_ext *)0x0;
    }
  }
  return;
}

Assistant:

static void
lysp_ext_free(struct lysf_ctx *ctx, struct lysp_ext *ext)
{
    lydict_remove(ctx->ctx, ext->name);
    lydict_remove(ctx->ctx, ext->argname);
    lydict_remove(ctx->ctx, ext->dsc);
    lydict_remove(ctx->ctx, ext->ref);
    FREE_ARRAY(ctx, ext->exts, lysp_ext_instance_free);
    if (ext->compiled) {
        lysc_extension_free(ctx, &ext->compiled);
    }
}